

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
               (CodedInputStream *input,int64_t *value)

{
  bool bVar1;
  uint64_t local_28;
  uint64_t temp;
  int64_t *value_local;
  CodedInputStream *input_local;
  
  temp = (uint64_t)value;
  value_local = (int64_t *)input;
  bVar1 = io::CodedInputStream::ReadLittleEndian64(input,&local_28);
  if (bVar1) {
    *(uint64_t *)temp = local_28;
  }
  return bVar1;
}

Assistant:

inline bool
WireFormatLite::ReadPrimitive<int64_t, WireFormatLite::TYPE_SFIXED64>(
    io::CodedInputStream* input, int64_t* value) {
  uint64_t temp;
  if (!input->ReadLittleEndian64(&temp)) return false;
  *value = static_cast<int64_t>(temp);
  return true;
}